

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucol_swp.cpp
# Opt level: O0

int32_t ucol_swap_63(UDataSwapper *ds,void *inData,int32_t length,void *outData,
                    UErrorCode *pErrorCode)

{
  UBool UVar1;
  int32_t iVar2;
  int local_4c;
  int32_t collationSize;
  UDataInfo *info;
  int32_t headerSize;
  UErrorCode *pErrorCode_local;
  void *outData_local;
  int32_t length_local;
  void *inData_local;
  UDataSwapper *ds_local;
  
  UVar1 = U_FAILURE(*pErrorCode);
  if (UVar1 == '\0') {
    iVar2 = udata_swapDataHeader_63(ds,inData,length,outData,pErrorCode);
    UVar1 = U_FAILURE(*pErrorCode);
    if (UVar1 == '\0') {
      if ((((*(char *)((long)inData + 0xc) == 'U') && (*(char *)((long)inData + 0xd) == 'C')) &&
          (*(char *)((long)inData + 0xe) == 'o')) &&
         (((*(char *)((long)inData + 0xf) == 'l' && (2 < *(byte *)((long)inData + 0x10))) &&
          (*(byte *)((long)inData + 0x10) < 6)))) {
        outData_local._4_4_ = length;
        if (-1 < length) {
          outData_local._4_4_ = length - iVar2;
        }
        if (*(byte *)((long)inData + 0x10) < 4) {
          local_4c = anon_unknown.dwarf_1320d2::swapFormatVersion3
                               (ds,(void *)((long)inData + (long)iVar2),outData_local._4_4_,
                                (void *)((long)outData + (long)iVar2),pErrorCode);
        }
        else {
          local_4c = anon_unknown.dwarf_1320d2::swapFormatVersion4
                               (ds,(void *)((long)inData + (long)iVar2),outData_local._4_4_,
                                (void *)((long)outData + (long)iVar2),pErrorCode);
        }
        UVar1 = U_SUCCESS(*pErrorCode);
        if (UVar1 == '\0') {
          ds_local._4_4_ = 0;
        }
        else {
          ds_local._4_4_ = iVar2 + local_4c;
        }
      }
      else {
        udata_printError_63(ds,
                            "ucol_swap(): data format %02x.%02x.%02x.%02x (format version %02x.%02x) is not recognized as collation data\n"
                            ,(ulong)*(byte *)((long)inData + 0xc),
                            (ulong)*(byte *)((long)inData + 0xd),
                            (ulong)*(byte *)((long)inData + 0xe),
                            (ulong)*(byte *)((long)inData + 0xf),
                            (uint)*(byte *)((long)inData + 0x10),
                            (uint)*(byte *)((long)inData + 0x11));
        *pErrorCode = U_UNSUPPORTED_ERROR;
        ds_local._4_4_ = 0;
      }
    }
    else {
      *pErrorCode = U_ZERO_ERROR;
      ds_local._4_4_ =
           anon_unknown.dwarf_1320d2::swapFormatVersion3(ds,inData,length,outData,pErrorCode);
    }
  }
  else {
    ds_local._4_4_ = 0;
  }
  return ds_local._4_4_;
}

Assistant:

U_CAPI int32_t U_EXPORT2
ucol_swap(const UDataSwapper *ds,
          const void *inData, int32_t length, void *outData,
          UErrorCode *pErrorCode) {
    if(U_FAILURE(*pErrorCode)) { return 0; }

    /* udata_swapDataHeader checks the arguments */
    int32_t headerSize=udata_swapDataHeader(ds, inData, length, outData, pErrorCode);
    if(U_FAILURE(*pErrorCode)) {
        // Try to swap the old format version which did not have a standard data header.
        *pErrorCode=U_ZERO_ERROR;
        return swapFormatVersion3(ds, inData, length, outData, pErrorCode);
    }

    /* check data format and format version */
    const UDataInfo &info=*(const UDataInfo *)((const char *)inData+4);
    if(!(
        info.dataFormat[0]==0x55 &&   // dataFormat="UCol"
        info.dataFormat[1]==0x43 &&
        info.dataFormat[2]==0x6f &&
        info.dataFormat[3]==0x6c &&
        (3<=info.formatVersion[0] && info.formatVersion[0]<=5)
    )) {
        udata_printError(ds, "ucol_swap(): data format %02x.%02x.%02x.%02x "
                         "(format version %02x.%02x) is not recognized as collation data\n",
                         info.dataFormat[0], info.dataFormat[1],
                         info.dataFormat[2], info.dataFormat[3],
                         info.formatVersion[0], info.formatVersion[1]);
        *pErrorCode=U_UNSUPPORTED_ERROR;
        return 0;
    }

    inData=(const char *)inData+headerSize;
    if(length>=0) { length-=headerSize; }
    outData=(char *)outData+headerSize;
    int32_t collationSize;
    if(info.formatVersion[0]>=4) {
        collationSize=swapFormatVersion4(ds, inData, length, outData, *pErrorCode);
    } else {
        collationSize=swapFormatVersion3(ds, inData, length, outData, pErrorCode);
    }
    if(U_SUCCESS(*pErrorCode)) {
        return headerSize+collationSize;
    } else {
        return 0;
    }
}